

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O0

void CRYPTO_chacha_20(uint8_t *out,uint8_t *in,size_t in_len,uint8_t *key,uint8_t *nonce,
                     uint32_t counter)

{
  int iVar1;
  uint8_t *local_58;
  uint64_t todo;
  uint32_t *key_ptr;
  uint32_t counter_nonce [4];
  uint32_t counter_local;
  uint8_t *nonce_local;
  uint8_t *key_local;
  size_t in_len_local;
  uint8_t *in_local;
  uint8_t *out_local;
  
  counter_nonce[3] = counter;
  iVar1 = buffers_alias(out,in_len,in,in_len);
  if (iVar1 != 0 && in != out) {
    __assert_fail("!buffers_alias(out, in_len, in, in_len) || in == out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/chacha/chacha.cc"
                  ,0x65,
                  "void CRYPTO_chacha_20(uint8_t *, const uint8_t *, size_t, const uint8_t *, const uint8_t *, uint32_t)"
                 );
  }
  key_ptr._0_4_ = counter_nonce[3];
  key_ptr._4_4_ = CRYPTO_load_u32_le(nonce);
  counter_nonce[0] = CRYPTO_load_u32_le(nonce + 4);
  counter_nonce[1] = CRYPTO_load_u32_le(nonce + 8);
  in_len_local = (size_t)in;
  in_local = out;
  for (key_local = (uint8_t *)in_len; key_local != (uint8_t *)0x0;
      key_local = key_local + -(long)local_58) {
    local_58 = (uint8_t *)((0x100000000 - (ulong)(uint)key_ptr) * 0x40);
    if (key_local < local_58) {
      local_58 = key_local;
    }
    ChaCha20_ctr32(in_local,(uint8_t *)in_len_local,(size_t)local_58,(uint32_t *)key,
                   (uint32_t *)&key_ptr);
    in_len_local = (size_t)(local_58 + in_len_local);
    in_local = local_58 + (long)in_local;
    key_ptr._0_4_ = 0;
  }
  return;
}

Assistant:

void CRYPTO_chacha_20(uint8_t *out, const uint8_t *in, size_t in_len,
                      const uint8_t key[32], const uint8_t nonce[12],
                      uint32_t counter) {
  assert(!buffers_alias(out, in_len, in, in_len) || in == out);

  uint32_t counter_nonce[4];
  counter_nonce[0] = counter;
  counter_nonce[1] = CRYPTO_load_u32_le(nonce + 0);
  counter_nonce[2] = CRYPTO_load_u32_le(nonce + 4);
  counter_nonce[3] = CRYPTO_load_u32_le(nonce + 8);

  const uint32_t *key_ptr = (const uint32_t *)key;
#if !defined(OPENSSL_X86) && !defined(OPENSSL_X86_64)
  // The assembly expects the key to be four-byte aligned.
  uint32_t key_u32[8];
  if ((((uintptr_t)key) & 3) != 0) {
    key_u32[0] = CRYPTO_load_u32_le(key + 0);
    key_u32[1] = CRYPTO_load_u32_le(key + 4);
    key_u32[2] = CRYPTO_load_u32_le(key + 8);
    key_u32[3] = CRYPTO_load_u32_le(key + 12);
    key_u32[4] = CRYPTO_load_u32_le(key + 16);
    key_u32[5] = CRYPTO_load_u32_le(key + 20);
    key_u32[6] = CRYPTO_load_u32_le(key + 24);
    key_u32[7] = CRYPTO_load_u32_le(key + 28);

    key_ptr = key_u32;
  }
#endif

  while (in_len > 0) {
    // The assembly functions do not have defined overflow behavior. While
    // overflow is almost always a bug in the caller, we prefer our functions to
    // behave the same across platforms, so divide into multiple calls to avoid
    // this case.
    uint64_t todo = 64 * ((UINT64_C(1) << 32) - counter_nonce[0]);
    if (todo > in_len) {
      todo = in_len;
    }

    ChaCha20_ctr32(out, in, (size_t)todo, key_ptr, counter_nonce);
    in += todo;
    out += todo;
    in_len -= todo;

    // We're either done and will next break out of the loop, or we stopped at
    // the wraparound point and the counter should continue at zero.
    counter_nonce[0] = 0;
  }
}